

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_context_destroy(cubeb_conflict *ctx)

{
  pa_operation *o;
  
  (*cubeb_pa_threaded_mainloop_lock)(ctx->mainloop);
  o = (*cubeb_pa_context_drain)(ctx->context,context_notify_callback,ctx);
  if (o != (pa_operation *)0x0) {
    operation_wait(ctx,(pa_stream *)0x0,o);
    (*cubeb_pa_operation_unref)(o);
  }
  (*cubeb_pa_context_set_state_callback)(ctx->context,(pa_context_notify_cb_t)0x0,(void *)0x0);
  (*cubeb_pa_context_disconnect)(ctx->context);
  (*cubeb_pa_context_unref)(ctx->context);
  (*cubeb_pa_threaded_mainloop_unlock)(ctx->mainloop);
  return;
}

Assistant:

static void
pulse_context_destroy(cubeb * ctx)
{
  pa_operation * o;

  WRAP(pa_threaded_mainloop_lock)(ctx->mainloop);
  o = WRAP(pa_context_drain)(ctx->context, context_notify_callback, ctx);
  if (o) {
    operation_wait(ctx, NULL, o);
    WRAP(pa_operation_unref)(o);
  }
  WRAP(pa_context_set_state_callback)(ctx->context, NULL, NULL);
  WRAP(pa_context_disconnect)(ctx->context);
  WRAP(pa_context_unref)(ctx->context);
  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);
}